

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_shr_u16(c_v128 a,uint c)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  c_v128 cVar3;
  c_v128 cVar4;
  
  auVar1 = in_ZMM0._0_16_;
  if (c < 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64[1];
    auVar1 = vpmovzxwd_avx(auVar1);
    auVar1 = vpsrld_avx(auVar1,ZEXT416(c));
    auVar1 = vpackusdw_avx(auVar1,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a.u64[0];
    auVar2 = vpmovzxwd_avx(auVar2);
    auVar2 = vpsrld_avx(auVar2,ZEXT416(c));
    auVar2 = vpackusdw_avx(auVar2,auVar2);
    cVar3.u64[1] = auVar1._0_8_;
    cVar3.u64[0] = auVar2._0_8_;
    return cVar3;
  }
  c_v128_shr_u16();
  vpsrlw_avx(auVar1,ZEXT416(c));
  cVar4.u64[1] = extraout_RDX;
  cVar4.u64[0] = extraout_RAX;
  return cVar4;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = a.u16[c] >> n;
  return t;
}